

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O0

PyObject * libxml_xmlParseEntity(PyObject *self,PyObject *args)

{
  int iVar1;
  undefined8 local_38;
  char *filename;
  xmlDocPtr c_retval;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = libxml_deprecationWarning("xmlParseEntity");
  if (iVar1 == -1) {
    self_local = (PyObject *)0x0;
  }
  else {
    iVar1 = _PyArg_ParseTuple_SizeT(py_retval,"z:xmlParseEntity",&local_38);
    if (iVar1 == 0) {
      self_local = (PyObject *)0x0;
    }
    else {
      filename = (char *)xmlParseEntity(local_38);
      self_local = libxml_xmlDocPtrWrap((xmlDocPtr)filename);
    }
  }
  return self_local;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_xmlParseEntity(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    xmlDocPtr c_retval;
    char * filename;

    if (libxml_deprecationWarning("xmlParseEntity") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"z:xmlParseEntity", &filename))
        return(NULL);

    c_retval = xmlParseEntity(filename);
    py_retval = libxml_xmlDocPtrWrap((xmlDocPtr) c_retval);
    return(py_retval);
}